

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t offset;
  size_t sVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_1f0;
  ulong local_188;
  int p;
  NumberCharacter *decimal;
  size_t length;
  bool cont;
  int maxExp_1;
  int maxExp;
  bool expMinus;
  int exp;
  size_t decimalPosition;
  int expFrac;
  int iStack_78;
  bool useDouble;
  int significandDigit;
  bool use64bit;
  uint64_t i64;
  uint i;
  bool minus;
  bool useNanOrInf;
  double d;
  size_t startOffset;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false> local_40;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false> s;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *handler_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy((StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *)&s,
                  is);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::
  NumberStream(&local_40,
               (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)this,(GenericStringStream<rapidjson::UTF8<char>_> *)&s);
  offset = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
           NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
           ::Tell(&local_40);
  _i = 0.0;
  bVar1 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,char,false,false>>
                    (&local_40,'-');
  i64._0_4_ = 0;
  _significandDigit = 0;
  bVar5 = false;
  iStack_78 = 0;
  CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::
          Peek(&local_40);
  if (CVar2 == '0') {
    i64._0_4_ = 0;
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::
    TakePush(&local_40);
  }
  else {
    CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
            ::Peek(&local_40);
    bVar3 = false;
    if ('0' < CVar2) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Peek(&local_40);
      bVar3 = CVar2 < ':';
    }
    if (bVar3) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::TakePush(&local_40);
      i64._0_4_ = (int)CVar2 - 0x30;
      if (!bVar1) {
        do {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::Peek(&local_40);
          bVar3 = false;
          if ('/' < CVar2) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                    ::Peek(&local_40);
            bVar3 = CVar2 < ':';
          }
          if (!bVar3) goto LAB_00119c19;
          if (0x19999998 < (uint)i64) {
            bVar3 = true;
            if ((uint)i64 == 0x19999999) {
              CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::
                      NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                      ::Peek(&local_40);
              bVar3 = '5' < CVar2;
            }
            if (bVar3) goto LAB_00119b0c;
          }
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::TakePush(&local_40);
          i64._0_4_ = (uint)i64 * 10 + CVar2 + -0x30;
          iStack_78 = iStack_78 + 1;
        } while( true );
      }
      do {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar3 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::Peek(&local_40);
          bVar3 = CVar2 < ':';
        }
        if (!bVar3) goto LAB_00119c19;
        if (0xccccccb < (uint)i64) {
          bVar3 = true;
          if ((uint)i64 == 0xccccccc) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                    ::Peek(&local_40);
            bVar3 = '8' < CVar2;
          }
          if (bVar3) goto LAB_001199f5;
        }
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::TakePush(&local_40);
        i64._0_4_ = (uint)i64 * 10 + CVar2 + -0x30;
        iStack_78 = iStack_78 + 1;
      } while( true );
    }
    bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x60c,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
            ::Tell(&local_40);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this,kParseErrorValueInvalid,sVar6);
    bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
    if (bVar3) goto LAB_0011abae;
  }
  goto LAB_00119c19;
LAB_00119b0c:
  _significandDigit = (ulong)(uint)i64;
  bVar5 = true;
  goto LAB_00119c19;
LAB_00119e53:
  auVar9._8_4_ = (int)(_significandDigit >> 0x20);
  auVar9._0_8_ = _significandDigit;
  auVar9._12_4_ = 0x45300000;
  _i = (auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)_significandDigit) - 4503599627370496.0);
  bVar3 = true;
  goto LAB_00119ed8;
LAB_00119cff:
  auVar8._8_4_ = (int)(_significandDigit >> 0x20);
  auVar8._0_8_ = _significandDigit;
  auVar8._12_4_ = 0x45300000;
  _i = (auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)_significandDigit) - 4503599627370496.0);
  bVar3 = true;
  goto LAB_00119ed8;
LAB_001199f5:
  _significandDigit = (ulong)(uint)i64;
  bVar5 = true;
LAB_00119c19:
  bVar3 = false;
  if (bVar5) {
    if (!bVar1) {
      do {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar4 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::Peek(&local_40);
          bVar4 = CVar2 < ':';
        }
        if (!bVar4) goto LAB_00119ed8;
        if (0x1999999999999998 < _significandDigit) {
          bVar4 = true;
          if (_significandDigit == 0x1999999999999999) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                    ::Peek(&local_40);
            bVar4 = '5' < CVar2;
          }
          if (bVar4) goto LAB_00119e53;
        }
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::TakePush(&local_40);
        _significandDigit = _significandDigit * 10 + (ulong)((int)CVar2 - 0x30);
        iStack_78 = iStack_78 + 1;
      } while( true );
    }
    do {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Peek(&local_40);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (0xccccccccccccccb < _significandDigit) {
        bVar4 = true;
        if (_significandDigit == 0xccccccccccccccc) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::Peek(&local_40);
          bVar4 = '8' < CVar2;
        }
        if (bVar4) goto LAB_00119cff;
      }
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::TakePush(&local_40);
      _significandDigit = _significandDigit * 10 + (ulong)((int)CVar2 - 0x30);
      iStack_78 = iStack_78 + 1;
    } while( true );
  }
LAB_00119ed8:
  if (bVar3) {
    while( true ) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Peek(&local_40);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::TakePush(&local_40);
      _i = _i * 10.0 + (double)(CVar2 + -0x30);
    }
  }
  decimalPosition._4_4_ = 0;
  bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,char,false,false>>
                    (&local_40,'.');
  if (bVar4) {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::Length
              (&local_40);
    CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
            ::Peek(&local_40);
    bVar4 = false;
    if ('/' < CVar2) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Peek(&local_40);
      bVar4 = CVar2 < ':';
    }
    if (!bVar4) {
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x637,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Tell(&local_40);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorNumberMissFraction,sVar6);
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (bVar4) goto LAB_0011abae;
    }
    if (!bVar3) {
      if (!bVar5) {
        _significandDigit = (ulong)(uint)i64;
      }
      while( true ) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar3 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::Peek(&local_40);
          bVar3 = CVar2 < ':';
        }
        if ((!bVar3) || (0x1fffffffffffff < _significandDigit)) break;
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::TakePush(&local_40);
        _significandDigit = _significandDigit * 10 + (ulong)((int)CVar2 - 0x30);
        decimalPosition._4_4_ = decimalPosition._4_4_ + -1;
        if (_significandDigit != 0) {
          iStack_78 = iStack_78 + 1;
        }
      }
      auVar10._8_4_ = (int)(_significandDigit >> 0x20);
      auVar10._0_8_ = _significandDigit;
      auVar10._12_4_ = 0x45300000;
      _i = (auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)_significandDigit) - 4503599627370496.0);
      bVar3 = true;
    }
    while( true ) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Peek(&local_40);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (iStack_78 < 0x11) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::TakePush(&local_40);
        _i = _i * 10.0 + (double)(CVar2 + -0x30);
        decimalPosition._4_4_ = decimalPosition._4_4_ + -1;
        if (0.0 < _i) {
          iStack_78 = iStack_78 + 1;
        }
      }
      else {
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::
        TakePush(&local_40);
      }
    }
  }
  else {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::Length
              (&local_40);
  }
  maxExp = 0;
  bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,char,false,false>>
                    (&local_40,'e');
  if ((bVar4) ||
     (bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,char,false,false>>
                        (&local_40,'E'), bVar4)) {
    if (!bVar3) {
      if (bVar5) {
        local_188 = _significandDigit;
      }
      else {
        local_188 = (ulong)(uint)i64;
      }
      auVar11._8_4_ = (int)(local_188 >> 0x20);
      auVar11._0_8_ = local_188;
      auVar11._12_4_ = 0x45300000;
      _i = (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_188) - 4503599627370496.0);
      bVar3 = true;
    }
    maxExp_1._3_1_ = false;
    bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,char,false,false>>
                      (&local_40,'+');
    if (!bVar4) {
      maxExp_1._3_1_ =
           Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,char,false,false>>
                     (&local_40,'-');
    }
    CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
            ::Peek(&local_40);
    bVar4 = false;
    if ('/' < CVar2) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Peek(&local_40);
      bVar4 = CVar2 < ':';
    }
    if (bVar4) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Take(&local_40);
      maxExp = CVar2 + -0x30;
      if (maxExp_1._3_1_ == false) {
        do {
          do {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                    ::Peek(&local_40);
            bVar4 = false;
            if ('/' < CVar2) {
              CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::
                      NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                      ::Peek(&local_40);
              bVar4 = CVar2 < ':';
            }
            if (!bVar4) goto LAB_0011a849;
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                    ::Take(&local_40);
            maxExp = maxExp * 10 + CVar2 + -0x30;
          } while (maxExp <= 0x134 - decimalPosition._4_4_);
          bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (((bVar4 ^ 0xffU) & 1) == 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                          ,0x687,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this,kParseErrorNumberTooBig,offset);
          bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
        } while (!bVar4);
        goto LAB_0011abae;
      }
      if (0 < decimalPosition._4_4_) {
        __assert_fail("expFrac <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x677,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      while( true ) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Peek(&local_40);
        bVar4 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                  ::Peek(&local_40);
          bVar4 = CVar2 < ':';
        }
        if (!bVar4) break;
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                ::Take(&local_40);
        maxExp = maxExp * 10 + CVar2 + -0x30;
        if ((decimalPosition._4_4_ + 0x7ffffff7) / 10 < maxExp) {
          while( true ) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                    ::Peek(&local_40);
            bVar4 = false;
            if ('/' < CVar2) {
              CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::
                      NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
                      ::Peek(&local_40);
              bVar4 = CVar2 < ':';
            }
            if (!bVar4) break;
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
            ::Take(&local_40);
          }
        }
      }
    }
    else {
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x68c,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>
              ::Tell(&local_40);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorNumberMissExponent,sVar6);
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (bVar4) goto LAB_0011abae;
    }
LAB_0011a849:
    if (maxExp_1._3_1_ != false) {
      maxExp = -maxExp;
    }
  }
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::Length
            (&local_40);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_char,_false,_false>::Pop
            (&local_40);
  if (bVar3) {
    local_1f0 = internal::StrtodNormalPrecision(_i,maxExp + decimalPosition._4_4_);
    dVar7 = std::numeric_limits<double>::max();
    if (dVar7 < local_1f0) {
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x6bb,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorNumberTooBig,offset);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (bVar5) goto LAB_0011abae;
    }
    if (bVar1) {
      local_1f0 = -local_1f0;
    }
    length._7_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Double(handler,local_1f0);
  }
  else if (bVar5) {
    if (bVar1) {
      length._7_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Int64(handler,-_significandDigit);
    }
    else {
      length._7_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Uint64(handler,_significandDigit);
    }
  }
  else if (bVar1) {
    length._7_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int(handler,-(uint)i64);
  }
  else {
    length._7_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint(handler,(uint)i64);
  }
  if (((length._7_1_ ^ 0xffU) & 1) != 0) {
    bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x6d3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this,kParseErrorTermination,offset);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this);
  }
LAB_0011abae:
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy((StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *)&s)
  ;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        typedef typename internal::SelectIf<internal::BoolType<(parseFlags & kParseNumbersAsStringsFlag) != 0>, typename TargetEncoding::Ch, char>::Type NumberCharacter;

        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, NumberCharacter,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (!useNanOrInf && Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (!useNanOrInf && (Consume(s, 'e') || Consume(s, 'E'))) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                GenericStringStream<UTF8<NumberCharacter> > srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<typename TargetEncoding::Ch>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const NumberCharacter* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }